

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

iterator __thiscall QString::erase(QString *this,const_iterator first,const_iterator last)

{
  iterator pQVar1;
  long lVar2;
  
  lVar2 = (long)first - (long)(this->d).ptr;
  remove(this,(char *)(lVar2 >> 1));
  pQVar1 = begin(this);
  return (iterator)((long)pQVar1 + lVar2);
}

Assistant:

QString::iterator QString::erase(QString::const_iterator first, QString::const_iterator last)
{
    const auto start = std::distance(cbegin(), first);
    const auto len = std::distance(first, last);
    remove(start, len);
    return begin() + start;
}